

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_disto.c
# Opt level: O0

size_t ReadPicture(char *filename,WebPPicture *pic,int keep_alpha)

{
  int iVar1;
  WebPImageReader p_Var2;
  int in_EDX;
  WebPPicture *in_RSI;
  undefined8 in_RDI;
  int ok;
  WebPImageReader reader;
  size_t data_size;
  uint8_t *data;
  size_t in_stack_ffffffffffffffb8;
  uint8_t *in_stack_ffffffffffffffc0;
  int local_34;
  size_t sVar3;
  uint8_t *__ptr;
  undefined4 in_stack_ffffffffffffffe8;
  
  __ptr = (uint8_t *)0x0;
  sVar3 = 0;
  iVar1 = ImgIoUtilReadFile((char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),(uint8_t **)0x0,
                            (size_t *)0x0);
  if (iVar1 == 0) {
    local_34 = 0;
  }
  else {
    in_RSI->use_argb = 1;
    p_Var2 = WebPGuessImageReader(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    local_34 = (*p_Var2)(__ptr,sVar3,in_RSI,in_EDX,(Metadata *)0x0);
  }
  if (local_34 == 0) {
    fprintf(stderr,"Error! Could not process file %s\n",in_RDI);
  }
  free(__ptr);
  if (local_34 == 0) {
    sVar3 = 0;
  }
  return sVar3;
}

Assistant:

static size_t ReadPicture(const char* const filename, WebPPicture* const pic,
                          int keep_alpha) {
  const uint8_t* data = NULL;
  size_t data_size = 0;
  WebPImageReader reader = NULL;
  int ok = ImgIoUtilReadFile(filename, &data, &data_size);
  if (!ok) goto End;

  pic->use_argb = 1;  // force ARGB

#ifdef HAVE_WINCODEC_H
  // Try to decode the file using WIC falling back to the other readers for
  // e.g., WebP.
  ok = ReadPictureWithWIC(filename, pic, keep_alpha, NULL);
  if (ok) goto End;
#endif
  reader = WebPGuessImageReader(data, data_size);
  ok = reader(data, data_size, pic, keep_alpha, NULL);

 End:
  if (!ok) {
    WFPRINTF(stderr, "Error! Could not process file %s\n",
             (const W_CHAR*)filename);
  }
  free((void*)data);
  return ok ? data_size : 0;
}